

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O0

bool vera::inside(vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  *_points,vec2 _v)

{
  size_type sVar1;
  const_reference pvVar2;
  float *pfVar3;
  ulong local_50;
  size_t i;
  size_t N;
  vec2 p2;
  vec2 p1;
  double xinters;
  int counter;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *_points_local;
  anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 aStack_10;
  vec2 _v_local;
  
  xinters._4_4_ = 0;
  sVar1 = std::
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          ::size(_points);
  pvVar2 = std::
           vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           ::operator[](_points,0);
  p2 = *pvVar2;
  for (local_50 = 1; local_50 <= sVar1; local_50 = local_50 + 1) {
    pvVar2 = std::
             vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ::operator[](_points,local_50 % sVar1);
    N = *(size_t *)pvVar2;
    aStack_10 = _v.field_1;
    pfVar3 = std::min<float>(&p2.field_1.y,(float *)((long)&N + 4));
    if ((*pfVar3 <= aStack_10.y && aStack_10.y != *pfVar3) &&
       (pfVar3 = std::max<float>(&p2.field_1.y,(float *)((long)&N + 4)), aStack_10.y <= *pfVar3)) {
      _points_local._4_4_ = _v.field_0;
      pfVar3 = std::max<float>((float *)&p2,(float *)&N);
      if (_points_local._4_4_ <= *pfVar3) {
        if ((p2.field_1.y != N._4_4_) || (NAN(p2.field_1.y) || NAN(N._4_4_))) {
          if (((p2.field_0.x == (float)N) && (!NAN(p2.field_0.x) && !NAN((float)N))) ||
             (_points_local._4_4_ <=
              ((aStack_10.y - p2.field_1.y) * ((float)N - p2.field_0.x)) / (N._4_4_ - p2.field_1.y)
              + p2.field_0.x)) {
            xinters._4_4_ = xinters._4_4_ + 1;
          }
        }
      }
    }
    p2.field_0.x = (float)N;
    p2.field_1.y = N._4_4_;
  }
  return xinters._4_4_ % 2 != 0;
}

Assistant:

bool inside(const std::vector<glm::vec2> _points, const glm::vec2 _v) {
    int counter = 0;
    double xinters;
    glm::vec2 p1,p2;

    size_t N = _points.size();
    p1 = _points[0];
    for (size_t i = 1; i <= N; i++) {
        p2 = _points[i % N];
        if (_v.y > std::min(p1.y, p2.y)) {
            if (_v.y <= std::max(p1.y, p2.y)) {
                if (_v.x <= std::max(p1.x, p2.x)) {
                    if (p1.y != p2.y) {
                        xinters = (_v.y - p1.y) * (p2.x - p1.x) / (p2.y - p1.y) + p1.x;
                        if (p1.x == p2.x || _v.x <= xinters)
                            counter++;
                    }
                }
            }
        }
        p1 = p2;
    }

    if (counter % 2 == 0) return false;
    else return true;
}